

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Translator_X86.cpp
# Opt level: O1

int TestRegEncoding(CodeGenGenericContext *ctx,uchar *stream,x86Command op,
                   _func_int_uchar_ptr_x86Reg *fun)

{
  x86Reg reg1;
  int iVar1;
  uchar *puVar2;
  long lVar3;
  int local_38;
  
  lVar3 = 0;
  puVar2 = stream;
  do {
    reg1 = *(x86Reg *)((long)testRegs + lVar3);
    EMIT_OP_REG(ctx,op,reg1);
    iVar1 = (*fun)(puVar2,reg1);
    puVar2 = puVar2 + iVar1;
    lVar3 = lVar3 + 4;
  } while (lVar3 != 0x24);
  local_38 = (int)stream;
  return (int)puVar2 - local_38;
}

Assistant:

int TestRegEncoding(CodeGenGenericContext &ctx, unsigned char *stream, x86Command op, int (*fun)(unsigned char *stream, x86Reg reg))
{
	unsigned char *start = stream;

	for(unsigned reg = 0; reg < sizeof(testRegs) / sizeof(testRegs[0]); reg++)
	{
		EMIT_OP_REG(ctx, op, testRegs[reg]);
		stream += fun(stream, testRegs[reg]);
	}

	return int(stream - start);
}